

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactTuple.h
# Opt level: O2

void __thiscall
chrono::ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>::
Reset_cinfo(ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
            *this,ChContactable_3vars<6,_6,_6> *mobjA,ChContactable_1vars<6> *mobjB,
           ChCollisionInfo *cinfo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  uint __line;
  char *__assertion;
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> Vx;
  undefined1 auVar5 [64];
  
  if (mobjA == (ChContactable_3vars<6,_6,_6> *)0x0) {
    __assertion = "mobjA";
    __line = 0x50;
  }
  else {
    if (mobjB != (ChContactable_1vars<6> *)0x0) {
      this->objA = mobjA;
      this->objB = mobjB;
      if ((ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_> *)
          cinfo != this) {
        (this->p1).m_data[0] = (cinfo->vpA).m_data[0];
        (this->p1).m_data[1] = (cinfo->vpA).m_data[1];
        (this->p1).m_data[2] = (cinfo->vpA).m_data[2];
        (this->p2).m_data[0] = (cinfo->vpB).m_data[0];
        (this->p2).m_data[1] = (cinfo->vpB).m_data[1];
        (this->p2).m_data[2] = (cinfo->vpB).m_data[2];
        (this->normal).m_data[0] = (cinfo->vN).m_data[0];
        (this->normal).m_data[1] = (cinfo->vN).m_data[1];
        (this->normal).m_data[2] = (cinfo->vN).m_data[2];
      }
      dVar3 = cinfo->eff_radius;
      this->norm_dist = cinfo->distance;
      this->eff_radius = dVar3;
      Vx.m_data[2] = 0.0;
      Vy.m_data[2] = 0.0;
      Vz.m_data[2] = 0.0;
      Vz.m_data._0_16_ = ZEXT816(0) << 0x20;
      Vy.m_data._0_16_ = Vz.m_data._0_16_;
      Vx.m_data._0_16_ = Vz.m_data._0_16_;
      XdirToDxDyDz<double>(&this->normal,(ChVector<double> *)&VECT_Y,&Vx,&Vy,&Vz);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = Vx.m_data[2];
      auVar4 = vbroadcastsd_avx512f(auVar1);
      auVar4 = vpermi2pd_avx512f(_DAT_00e71c80,ZEXT2464(CONCAT816(auVar4._16_8_,Vx.m_data._0_16_)),
                                 ZEXT1664((undefined1  [16])Vy.m_data._0_16_));
      auVar2._8_8_ = 0;
      auVar2._0_8_ = Vy.m_data[2];
      auVar5 = vbroadcastsd_avx512f(auVar2);
      auVar6._0_40_ = auVar4._0_40_;
      auVar6._40_8_ = auVar5._40_8_;
      auVar6._48_8_ = auVar4._48_8_;
      auVar6._56_8_ = auVar4._56_8_;
      auVar4 = vpermi2pd_avx512f(_DAT_00e71cc0,auVar6,ZEXT1664((undefined1  [16])Vz.m_data._0_16_));
      *(undefined1 (*) [64])
       (this->contact_plane).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar4;
      (this->contact_plane).super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           Vz.m_data[2];
      return;
    }
    __assertion = "mobjB";
    __line = 0x51;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                ,__line,
                "void chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_1vars<6>>::Reset_cinfo(Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_1vars<6>]"
               );
}

Assistant:

void Reset_cinfo(Ta* mobjA,                               ///< ChContactable object A
                     Tb* mobjB,                               ///< ChContactable object B
                     const collision::ChCollisionInfo& cinfo  ///< data for the contact pair
    ) {
        assert(mobjA);
        assert(mobjB);

        this->objA = mobjA;
        this->objB = mobjB;

        this->p1 = cinfo.vpA;
        this->p2 = cinfo.vpB;
        this->normal = cinfo.vN;
        this->norm_dist = cinfo.distance;
        this->eff_radius = cinfo.eff_radius;

        // Contact plane
        ChVector<> Vx, Vy, Vz;
        XdirToDxDyDz(normal, VECT_Y, Vx, Vy, Vz);
        contact_plane.Set_A_axis(Vx, Vy, Vz);
    }